

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgpsec_utils.c
# Opt level: O0

int get_sig_seg_size(rtr_signature_seg *sig_segs,align_type type)

{
  long in_FS_OFFSET;
  rtr_signature_seg *local_30;
  rtr_signature_seg *curr;
  uint sig_segs_size;
  align_type type_local;
  rtr_signature_seg *sig_segs_local;
  
  curr._0_4_ = 0;
  if (sig_segs == (rtr_signature_seg *)0x0) {
    sig_segs_local._4_4_ = 0;
  }
  else {
    local_30 = sig_segs;
    if (type == VALIDATION) {
      local_30 = sig_segs->next;
    }
    for (; local_30 != (rtr_signature_seg *)0x0; local_30 = local_30->next) {
      curr._0_4_ = (int)curr + local_30->sig_len + 0x16;
    }
    sig_segs_local._4_4_ = (int)curr;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != *(long *)(in_FS_OFFSET + 0x28)) {
    __stack_chk_fail();
  }
  return sig_segs_local._4_4_;
}

Assistant:

int get_sig_seg_size(const struct rtr_signature_seg *sig_segs, enum align_type type)
{
	unsigned int sig_segs_size = 0;

	if (!sig_segs)
		return 0;

	/* Iterate over all signature segments and add the calculated
	 * length to sig_segs_size. Return the sum at the end.
	 */
	const struct rtr_signature_seg *curr = sig_segs;

	if (type == VALIDATION)
		curr = curr->next;

	while (curr) {
		sig_segs_size += curr->sig_len + sizeof(curr->sig_len) + SKI_SIZE;
		curr = curr->next;
	}

	return sig_segs_size;
}